

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  byte bVar19;
  uint uVar20;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 in_R9;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined4 uVar86;
  vint4 bi_2;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_1;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar121;
  float fVar122;
  vint4 ai_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  vint4 bi;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 ai_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vfloat4 a0_3;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  vfloat4 a0_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar218;
  float fVar219;
  vfloat4 a0;
  undefined1 auVar211 [16];
  float fVar220;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  vfloat4 a0_1;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_314;
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  undefined4 local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar21;
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar230 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  fVar209 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  auVar52._0_4_ = fVar209 * auVar35._0_4_;
  auVar52._4_4_ = fVar209 * auVar35._4_4_;
  auVar52._8_4_ = fVar209 * auVar35._8_4_;
  auVar52._12_4_ = fVar209 * auVar35._12_4_;
  auVar43._0_4_ = fVar209 * (ray->dir).field_0.m128[0];
  auVar43._4_4_ = fVar209 * (ray->dir).field_0.m128[1];
  auVar43._8_4_ = fVar209 * (ray->dir).field_0.m128[2];
  auVar43._12_4_ = fVar209 * (ray->dir).field_0.m128[3];
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xb + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xc + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xd + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x12 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x13 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x14 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar221._4_4_ = auVar43._0_4_;
  auVar221._0_4_ = auVar43._0_4_;
  auVar221._8_4_ = auVar43._0_4_;
  auVar221._12_4_ = auVar43._0_4_;
  auVar49 = vshufps_avx(auVar43,auVar43,0x55);
  auVar39 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar209 = auVar39._0_4_;
  auVar124._0_4_ = fVar209 * auVar37._0_4_;
  fVar190 = auVar39._4_4_;
  auVar124._4_4_ = fVar190 * auVar37._4_4_;
  fVar202 = auVar39._8_4_;
  auVar124._8_4_ = fVar202 * auVar37._8_4_;
  fVar204 = auVar39._12_4_;
  auVar124._12_4_ = fVar204 * auVar37._12_4_;
  auVar48._0_4_ = auVar46._0_4_ * fVar209;
  auVar48._4_4_ = auVar46._4_4_ * fVar190;
  auVar48._8_4_ = auVar46._8_4_ * fVar202;
  auVar48._12_4_ = auVar46._12_4_ * fVar204;
  auVar87._0_4_ = auVar41._0_4_ * fVar209;
  auVar87._4_4_ = auVar41._4_4_ * fVar190;
  auVar87._8_4_ = auVar41._8_4_ * fVar202;
  auVar87._12_4_ = auVar41._12_4_ * fVar204;
  auVar39 = vfmadd231ps_fma(auVar124,auVar49,auVar36);
  auVar40 = vfmadd231ps_fma(auVar48,auVar49,auVar45);
  auVar49 = vfmadd231ps_fma(auVar87,auVar50,auVar49);
  auVar42 = vfmadd231ps_fma(auVar39,auVar221,auVar35);
  auVar40 = vfmadd231ps_fma(auVar40,auVar221,auVar38);
  auVar43 = vfmadd231ps_fma(auVar49,auVar44,auVar221);
  auVar222._4_4_ = auVar52._0_4_;
  auVar222._0_4_ = auVar52._0_4_;
  auVar222._8_4_ = auVar52._0_4_;
  auVar222._12_4_ = auVar52._0_4_;
  auVar49 = vshufps_avx(auVar52,auVar52,0x55);
  auVar39 = vshufps_avx(auVar52,auVar52,0xaa);
  fVar209 = auVar39._0_4_;
  auVar231._0_4_ = fVar209 * auVar37._0_4_;
  fVar190 = auVar39._4_4_;
  auVar231._4_4_ = fVar190 * auVar37._4_4_;
  fVar202 = auVar39._8_4_;
  auVar231._8_4_ = fVar202 * auVar37._8_4_;
  fVar204 = auVar39._12_4_;
  auVar231._12_4_ = fVar204 * auVar37._12_4_;
  auVar114._0_4_ = auVar46._0_4_ * fVar209;
  auVar114._4_4_ = auVar46._4_4_ * fVar190;
  auVar114._8_4_ = auVar46._8_4_ * fVar202;
  auVar114._12_4_ = auVar46._12_4_ * fVar204;
  auVar102._0_4_ = auVar41._0_4_ * fVar209;
  auVar102._4_4_ = auVar41._4_4_ * fVar190;
  auVar102._8_4_ = auVar41._8_4_ * fVar202;
  auVar102._12_4_ = auVar41._12_4_ * fVar204;
  auVar36 = vfmadd231ps_fma(auVar231,auVar49,auVar36);
  auVar37 = vfmadd231ps_fma(auVar114,auVar49,auVar45);
  auVar45 = vfmadd231ps_fma(auVar102,auVar49,auVar50);
  auVar50 = vfmadd231ps_fma(auVar36,auVar222,auVar35);
  auVar41 = vfmadd231ps_fma(auVar37,auVar222,auVar38);
  auVar49 = vfmadd231ps_fma(auVar45,auVar222,auVar44);
  auVar70._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar35);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar36 = vandps_avx512vl(auVar42,auVar35);
  uVar27 = vcmpps_avx512vl(auVar36,auVar133,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar39._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._12_4_;
  auVar36 = vandps_avx512vl(auVar40,auVar35);
  uVar27 = vcmpps_avx512vl(auVar36,auVar133,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar42._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._12_4_;
  auVar35 = vandps_avx512vl(auVar43,auVar35);
  uVar27 = vcmpps_avx512vl(auVar35,auVar133,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar39);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar240 = ZEXT1664(auVar36);
  auVar37 = vfnmadd213ps_avx512vl(auVar39,auVar35,auVar36);
  auVar37 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar42);
  auVar38 = vfnmadd213ps_avx512vl(auVar42,auVar35,auVar36);
  auVar46 = vfmadd132ps_fma(auVar38,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar40);
  auVar36 = vfnmadd213ps_avx512vl(auVar40,auVar35,auVar36);
  auVar44 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar50);
  auVar134._0_4_ = auVar37._0_4_ * auVar35._0_4_;
  auVar134._4_4_ = auVar37._4_4_ * auVar35._4_4_;
  auVar134._8_4_ = auVar37._8_4_ * auVar35._8_4_;
  auVar134._12_4_ = auVar37._12_4_ * auVar35._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar36);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar50);
  auVar125._0_4_ = auVar37._0_4_ * auVar35._0_4_;
  auVar125._4_4_ = auVar37._4_4_ * auVar35._4_4_;
  auVar125._8_4_ = auVar37._8_4_ * auVar35._8_4_;
  auVar125._12_4_ = auVar37._12_4_ * auVar35._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar26 * 0xe + 6);
  auVar35 = vpmovsxwd_avx(auVar37);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar41);
  auVar147._0_4_ = auVar46._0_4_ * auVar35._0_4_;
  auVar147._4_4_ = auVar46._4_4_ * auVar35._4_4_;
  auVar147._8_4_ = auVar46._8_4_ * auVar35._8_4_;
  auVar147._12_4_ = auVar46._12_4_ * auVar35._12_4_;
  auVar37 = vpbroadcastd_avx512vl();
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar35 = vpmovsxwd_avx(auVar38);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vsubps_avx(auVar35,auVar41);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 0x15 + 6);
  auVar35 = vpmovsxwd_avx(auVar45);
  auVar51._0_4_ = auVar46._0_4_ * auVar36._0_4_;
  auVar51._4_4_ = auVar46._4_4_ * auVar36._4_4_;
  auVar51._8_4_ = auVar46._8_4_ * auVar36._8_4_;
  auVar51._12_4_ = auVar46._12_4_ * auVar36._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar49);
  auVar115._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar115._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar115._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar115._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 0x17 + 6);
  auVar35 = vpmovsxwd_avx(auVar46);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar49);
  auVar47._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar47._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar47._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar47._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar134,auVar125);
  auVar36 = vpminsd_avx(auVar147,auVar51);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar115,auVar47);
  uVar86 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar44._4_4_ = uVar86;
  auVar44._0_4_ = uVar86;
  auVar44._8_4_ = uVar86;
  auVar44._12_4_ = uVar86;
  auVar36 = vmaxps_avx512vl(auVar36,auVar44);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar50._8_4_ = 0x3f7ffffa;
  auVar50._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar50._12_4_ = 0x3f7ffffa;
  local_118 = vmulps_avx512vl(auVar35,auVar50);
  auVar35 = vpmaxsd_avx(auVar134,auVar125);
  auVar36 = vpmaxsd_avx(auVar147,auVar51);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar115,auVar47);
  fVar209 = ray->tfar;
  auVar41._4_4_ = fVar209;
  auVar41._0_4_ = fVar209;
  auVar41._8_4_ = fVar209;
  auVar41._12_4_ = fVar209;
  auVar36 = vminps_avx512vl(auVar36,auVar41);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar49._8_4_ = 0x3f800003;
  auVar49._0_8_ = 0x3f8000033f800003;
  auVar49._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar49);
  uVar9 = vcmpps_avx512vl(local_118,auVar35,2);
  uVar10 = vpcmpgtd_avx512vl(auVar37,_DAT_01f4ad30);
  uVar27 = CONCAT44((int)((ulong)in_R9 >> 0x20),(uint)((byte)uVar9 & 0xf & (byte)uVar10));
  auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar242 = ZEXT1664(auVar70._0_16_);
  local_250 = prim;
LAB_0180f2d5:
  if (uVar27 == 0) {
LAB_01810d68:
    return uVar27 != 0;
  }
  lVar22 = 0;
  for (uVar26 = uVar27; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  local_310 = (ulong)*(uint *)(local_250 + 2);
  local_258 = (ulong)*(uint *)(local_250 + lVar22 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_258);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var8 + uVar25 * (long)pvVar7);
  auVar36 = *(undefined1 (*) [16])(_Var8 + (uVar25 + 1) * (long)pvVar7);
  auVar37 = *(undefined1 (*) [16])(_Var8 + (uVar25 + 2) * (long)pvVar7);
  auVar38 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar25 + 3));
  lVar22 = *(long *)&pGVar5[1].time_range.upper;
  auVar45 = *(undefined1 (*) [16])(lVar22 + (long)p_Var6 * uVar25);
  auVar46 = *(undefined1 (*) [16])(lVar22 + (long)p_Var6 * (uVar25 + 1));
  auVar44 = *(undefined1 (*) [16])(lVar22 + (long)p_Var6 * (uVar25 + 2));
  uVar26 = uVar27 - 1 & uVar27;
  auVar50 = *(undefined1 (*) [16])(lVar22 + (long)p_Var6 * (uVar25 + 3));
  if (uVar26 != 0) {
    uVar28 = uVar26 - 1 & uVar26;
    for (uVar25 = uVar26; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    }
    if (uVar28 != 0) {
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar53._16_16_ = auVar70._16_16_;
  auVar87 = auVar242._0_16_;
  auVar39 = vmulps_avx512vl(auVar50,auVar87);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar44,auVar39);
  auVar88._0_4_ = auVar46._0_4_ + auVar41._0_4_;
  auVar88._4_4_ = auVar46._4_4_ + auVar41._4_4_;
  auVar88._8_4_ = auVar46._8_4_ + auVar41._8_4_;
  auVar88._12_4_ = auVar46._12_4_ + auVar41._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar88,auVar45,auVar87);
  auVar53._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar41 = vmulps_avx512vl(auVar50,auVar53._0_16_);
  auVar226._8_4_ = 0x3f000000;
  auVar226._0_8_ = 0x3f0000003f000000;
  auVar226._12_4_ = 0x3f000000;
  auVar41 = vfmadd231ps_fma(auVar41,auVar44,auVar226);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar46,auVar53._0_16_);
  auVar49 = vfnmadd231ps_fma(auVar41,auVar45,auVar226);
  auVar42 = vmulps_avx512vl(auVar38,auVar87);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar42);
  auVar211._0_4_ = auVar41._0_4_ + auVar36._0_4_;
  auVar211._4_4_ = auVar41._4_4_ + auVar36._4_4_;
  auVar211._8_4_ = auVar41._8_4_ + auVar36._8_4_;
  auVar211._12_4_ = auVar41._12_4_ + auVar36._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar211,auVar35,auVar87);
  auVar41 = vmulps_avx512vl(auVar38,auVar53._0_16_);
  auVar41 = vfmadd231ps_fma(auVar41,auVar37,auVar226);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar53._0_16_);
  auVar41 = vfnmadd231ps_fma(auVar41,auVar35,auVar226);
  auVar103._0_4_ = auVar44._0_4_ + auVar39._0_4_;
  auVar103._4_4_ = auVar44._4_4_ + auVar39._4_4_;
  auVar103._8_4_ = auVar44._8_4_ + auVar39._8_4_;
  auVar103._12_4_ = auVar44._12_4_ + auVar39._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar103,auVar46,auVar53._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar87);
  auVar116._0_4_ = auVar50._0_4_ * 0.5;
  auVar116._4_4_ = auVar50._4_4_ * 0.5;
  auVar116._8_4_ = auVar50._8_4_ * 0.5;
  auVar116._12_4_ = auVar50._12_4_ * 0.5;
  auVar44 = vfmadd231ps_avx512vl(auVar116,auVar53._0_16_,auVar44);
  auVar46 = vfnmadd231ps_fma(auVar44,auVar226,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar53._0_16_,auVar45);
  auVar165._0_4_ = auVar42._0_4_ + auVar37._0_4_;
  auVar165._4_4_ = auVar42._4_4_ + auVar37._4_4_;
  auVar165._8_4_ = auVar42._8_4_ + auVar37._8_4_;
  auVar165._12_4_ = auVar42._12_4_ + auVar37._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar165,auVar36,auVar53._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar35,auVar87);
  auVar155._0_4_ = auVar38._0_4_ * 0.5;
  auVar155._4_4_ = auVar38._4_4_ * 0.5;
  auVar155._8_4_ = auVar38._8_4_ * 0.5;
  auVar155._12_4_ = auVar38._12_4_ * 0.5;
  auVar37 = vfmadd231ps_avx512vl(auVar155,auVar53._0_16_,auVar37);
  auVar36 = vfnmadd231ps_fma(auVar37,auVar226,auVar36);
  auVar46 = vfmadd231ps_avx512vl(auVar36,auVar53._0_16_,auVar35);
  auVar35 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar36 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar206 = auVar49._0_4_;
  auVar135._0_4_ = fVar206 * auVar36._0_4_;
  fVar207 = auVar49._4_4_;
  auVar135._4_4_ = fVar207 * auVar36._4_4_;
  fVar208 = auVar49._8_4_;
  auVar135._8_4_ = fVar208 * auVar36._8_4_;
  fVar101 = auVar49._12_4_;
  auVar135._12_4_ = fVar101 * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar135,auVar35,auVar43);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar136._0_4_ = fVar206 * auVar36._0_4_;
  auVar136._4_4_ = fVar207 * auVar36._4_4_;
  auVar136._8_4_ = fVar208 * auVar36._8_4_;
  auVar136._12_4_ = fVar101 * auVar36._12_4_;
  auVar35 = vfmsub231ps_fma(auVar136,auVar35,auVar41);
  auVar38 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar36 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar113 = auVar44._0_4_;
  auVar126._0_4_ = fVar113 * auVar36._0_4_;
  fVar121 = auVar44._4_4_;
  auVar126._4_4_ = fVar121 * auVar36._4_4_;
  fVar122 = auVar44._8_4_;
  auVar126._8_4_ = fVar122 * auVar36._8_4_;
  fVar123 = auVar44._12_4_;
  auVar126._12_4_ = fVar123 * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar126,auVar35,auVar45);
  auVar45 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar166._0_4_ = auVar36._0_4_ * fVar113;
  auVar166._4_4_ = auVar36._4_4_ * fVar121;
  auVar166._8_4_ = auVar36._8_4_ * fVar122;
  auVar166._12_4_ = auVar36._12_4_ * fVar123;
  auVar35 = vfmsub231ps_fma(auVar166,auVar35,auVar46);
  auVar46 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar190 = auVar35._0_4_;
  auVar68._4_28_ = auVar53._4_28_;
  auVar68._0_4_ = fVar190;
  auVar36 = vrsqrt14ss_avx512f(auVar53._0_16_,auVar68._0_16_);
  fVar209 = auVar36._0_4_;
  fVar209 = fVar209 * 1.5 + fVar190 * -0.5 * fVar209 * fVar209 * fVar209;
  auVar36 = vdpps_avx(auVar37,auVar38,0x7f);
  fVar210 = fVar209 * auVar37._0_4_;
  fVar218 = fVar209 * auVar37._4_4_;
  fVar219 = fVar209 * auVar37._8_4_;
  fVar220 = fVar209 * auVar37._12_4_;
  auVar173._0_4_ = auVar38._0_4_ * fVar190;
  auVar173._4_4_ = auVar38._4_4_ * fVar190;
  auVar173._8_4_ = auVar38._8_4_ * fVar190;
  auVar173._12_4_ = auVar38._12_4_ * fVar190;
  fVar190 = auVar36._0_4_;
  auVar148._0_4_ = fVar190 * auVar37._0_4_;
  auVar148._4_4_ = fVar190 * auVar37._4_4_;
  auVar148._8_4_ = fVar190 * auVar37._8_4_;
  auVar148._12_4_ = fVar190 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar173,auVar148);
  auVar36 = vrcp14ss_avx512f(auVar53._0_16_,auVar68._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar202 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar204 = auVar35._0_4_;
  auVar69._16_16_ = auVar53._16_16_;
  auVar69._0_16_ = auVar53._0_16_;
  auVar54._4_28_ = auVar69._4_28_;
  auVar54._0_4_ = fVar204;
  auVar36 = vrsqrt14ss_avx512f(auVar53._0_16_,auVar54._0_16_);
  fVar190 = auVar36._0_4_;
  fVar190 = fVar190 * 1.5 + fVar204 * -0.5 * fVar190 * fVar190 * fVar190;
  auVar36 = vdpps_avx(auVar45,auVar46,0x7f);
  fVar189 = fVar190 * auVar45._0_4_;
  fVar201 = fVar190 * auVar45._4_4_;
  fVar203 = fVar190 * auVar45._8_4_;
  fVar205 = fVar190 * auVar45._12_4_;
  auVar137._0_4_ = fVar204 * auVar46._0_4_;
  auVar137._4_4_ = fVar204 * auVar46._4_4_;
  auVar137._8_4_ = fVar204 * auVar46._8_4_;
  auVar137._12_4_ = fVar204 * auVar46._12_4_;
  fVar204 = auVar36._0_4_;
  auVar127._0_4_ = fVar204 * auVar45._0_4_;
  auVar127._4_4_ = fVar204 * auVar45._4_4_;
  auVar127._8_4_ = fVar204 * auVar45._8_4_;
  auVar127._12_4_ = fVar204 * auVar45._12_4_;
  auVar38 = vsubps_avx(auVar137,auVar127);
  auVar36 = vrcp14ss_avx512f(auVar53._0_16_,auVar54._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar204 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vshufps_avx(auVar40,auVar40,0xff);
  auVar156._0_4_ = fVar210 * auVar35._0_4_;
  auVar156._4_4_ = fVar218 * auVar35._4_4_;
  auVar156._8_4_ = fVar219 * auVar35._8_4_;
  auVar156._12_4_ = fVar220 * auVar35._12_4_;
  local_1a8 = vsubps_avx(auVar40,auVar156);
  auVar36 = vshufps_avx(auVar49,auVar49,0xff);
  auVar138._0_4_ = auVar36._0_4_ * fVar210 + auVar35._0_4_ * fVar209 * auVar37._0_4_ * fVar202;
  auVar138._4_4_ = auVar36._4_4_ * fVar218 + auVar35._4_4_ * fVar209 * auVar37._4_4_ * fVar202;
  auVar138._8_4_ = auVar36._8_4_ * fVar219 + auVar35._8_4_ * fVar209 * auVar37._8_4_ * fVar202;
  auVar138._12_4_ = auVar36._12_4_ * fVar220 + auVar35._12_4_ * fVar209 * auVar37._12_4_ * fVar202;
  auVar37 = vsubps_avx(auVar49,auVar138);
  local_1b8._0_4_ = auVar40._0_4_ + auVar156._0_4_;
  local_1b8._4_4_ = auVar40._4_4_ + auVar156._4_4_;
  fStack_1b0 = auVar40._8_4_ + auVar156._8_4_;
  fStack_1ac = auVar40._12_4_ + auVar156._12_4_;
  auVar35 = vshufps_avx(auVar39,auVar39,0xff);
  auVar139._0_4_ = fVar189 * auVar35._0_4_;
  auVar139._4_4_ = fVar201 * auVar35._4_4_;
  auVar139._8_4_ = fVar203 * auVar35._8_4_;
  auVar139._12_4_ = fVar205 * auVar35._12_4_;
  local_1c8 = vsubps_avx(auVar39,auVar139);
  auVar36 = vshufps_avx(auVar44,auVar44,0xff);
  auVar96._0_4_ = fVar189 * auVar36._0_4_ + auVar35._0_4_ * fVar190 * auVar38._0_4_ * fVar204;
  auVar96._4_4_ = fVar201 * auVar36._4_4_ + auVar35._4_4_ * fVar190 * auVar38._4_4_ * fVar204;
  auVar96._8_4_ = fVar203 * auVar36._8_4_ + auVar35._8_4_ * fVar190 * auVar38._8_4_ * fVar204;
  auVar96._12_4_ = fVar205 * auVar36._12_4_ + auVar35._12_4_ * fVar190 * auVar38._12_4_ * fVar204;
  auVar35 = vsubps_avx(auVar44,auVar96);
  _local_1d8 = vaddps_avx512vl(auVar39,auVar139);
  auVar104._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar104._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar104._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar104._12_4_ = auVar37._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar104);
  auVar105._0_4_ = auVar35._0_4_ * 0.33333334;
  auVar105._4_4_ = auVar35._4_4_ * 0.33333334;
  auVar105._8_4_ = auVar35._8_4_ * 0.33333334;
  auVar105._12_4_ = auVar35._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar105);
  auVar89._0_4_ = (fVar206 + auVar138._0_4_) * 0.33333334;
  auVar89._4_4_ = (fVar207 + auVar138._4_4_) * 0.33333334;
  auVar89._8_4_ = (fVar208 + auVar138._8_4_) * 0.33333334;
  auVar89._12_4_ = (fVar101 + auVar138._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar89);
  auVar90._0_4_ = (fVar113 + auVar96._0_4_) * 0.33333334;
  auVar90._4_4_ = (fVar121 + auVar96._4_4_) * 0.33333334;
  auVar90._8_4_ = (fVar122 + auVar96._8_4_) * 0.33333334;
  auVar90._12_4_ = (fVar123 + auVar96._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar90);
  aVar1 = (ray->org).field_0;
  auVar36 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar97._4_4_ = uVar86;
  auVar97._0_4_ = uVar86;
  auVar97._8_4_ = uVar86;
  auVar97._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar209 = (pre->ray_space).vz.field_0.m128[0];
  fVar190 = (pre->ray_space).vz.field_0.m128[1];
  fVar202 = (pre->ray_space).vz.field_0.m128[2];
  fVar204 = (pre->ray_space).vz.field_0.m128[3];
  auVar91._0_4_ = fVar209 * auVar36._0_4_;
  auVar91._4_4_ = fVar190 * auVar36._4_4_;
  auVar91._8_4_ = fVar202 * auVar36._8_4_;
  auVar91._12_4_ = fVar204 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar3,auVar35);
  auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar97);
  auVar36 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar106._4_4_ = uVar86;
  auVar106._0_4_ = uVar86;
  auVar106._8_4_ = uVar86;
  auVar106._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar98._0_4_ = fVar209 * auVar36._0_4_;
  auVar98._4_4_ = fVar190 * auVar36._4_4_;
  auVar98._8_4_ = fVar202 * auVar36._8_4_;
  auVar98._12_4_ = fVar204 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar35);
  auVar46 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar106);
  auVar36 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar157._4_4_ = uVar86;
  auVar157._0_4_ = uVar86;
  auVar157._8_4_ = uVar86;
  auVar157._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar107._0_4_ = fVar209 * auVar36._0_4_;
  auVar107._4_4_ = fVar190 * auVar36._4_4_;
  auVar107._8_4_ = fVar202 * auVar36._8_4_;
  auVar107._12_4_ = fVar204 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar3,auVar35);
  auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar157);
  auVar36 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar167._4_4_ = uVar86;
  auVar167._0_4_ = uVar86;
  auVar167._8_4_ = uVar86;
  auVar167._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar158._0_4_ = fVar209 * auVar36._0_4_;
  auVar158._4_4_ = fVar190 * auVar36._4_4_;
  auVar158._8_4_ = fVar202 * auVar36._8_4_;
  auVar158._12_4_ = fVar204 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar3,auVar35);
  auVar50 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar167);
  auVar36 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar174._4_4_ = uVar86;
  auVar174._0_4_ = uVar86;
  auVar174._8_4_ = uVar86;
  auVar174._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar168._0_4_ = auVar36._0_4_ * fVar209;
  auVar168._4_4_ = auVar36._4_4_ * fVar190;
  auVar168._8_4_ = auVar36._8_4_ * fVar202;
  auVar168._12_4_ = auVar36._12_4_ * fVar204;
  auVar35 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar3,auVar35);
  auVar41 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar174);
  auVar36 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar184._4_4_ = uVar86;
  auVar184._0_4_ = uVar86;
  auVar184._8_4_ = uVar86;
  auVar184._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar175._0_4_ = auVar36._0_4_ * fVar209;
  auVar175._4_4_ = auVar36._4_4_ * fVar190;
  auVar175._8_4_ = auVar36._8_4_ * fVar202;
  auVar175._12_4_ = auVar36._12_4_ * fVar204;
  auVar35 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar35);
  auVar49 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar184);
  auVar36 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar191._4_4_ = uVar86;
  auVar191._0_4_ = uVar86;
  auVar191._8_4_ = uVar86;
  auVar191._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar185._0_4_ = auVar36._0_4_ * fVar209;
  auVar185._4_4_ = auVar36._4_4_ * fVar190;
  auVar185._8_4_ = auVar36._8_4_ * fVar202;
  auVar185._12_4_ = auVar36._12_4_ * fVar204;
  auVar35 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar3,auVar35);
  auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar191);
  auVar36 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar86 = auVar36._0_4_;
  auVar192._4_4_ = uVar86;
  auVar192._0_4_ = uVar86;
  auVar192._8_4_ = uVar86;
  auVar192._12_4_ = uVar86;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar128._0_4_ = fVar209 * auVar36._0_4_;
  auVar128._4_4_ = fVar190 * auVar36._4_4_;
  auVar128._8_4_ = fVar202 * auVar36._8_4_;
  auVar128._12_4_ = fVar204 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar35);
  auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar192);
  local_308 = vmovlhps_avx512f(auVar45,auVar41);
  auVar243 = ZEXT1664(local_308);
  local_268 = vmovlhps_avx(auVar46,auVar49);
  local_278 = vmovlhps_avx512f(auVar44,auVar39);
  _local_f8 = vmovlhps_avx512f(auVar50,auVar40);
  auVar35 = vminps_avx512vl(local_308,local_268);
  auVar37 = vmaxps_avx512vl(local_308,local_268);
  auVar36 = vminps_avx512vl(local_278,_local_f8);
  auVar36 = vminps_avx(auVar35,auVar36);
  auVar35 = vmaxps_avx512vl(local_278,_local_f8);
  auVar35 = vmaxps_avx(auVar37,auVar35);
  auVar37 = vshufpd_avx(auVar36,auVar36,3);
  auVar38 = vshufpd_avx(auVar35,auVar35,3);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar35 = vmaxps_avx(auVar35,auVar38);
  auVar36 = vandps_avx512vl(auVar36,auVar239._0_16_);
  auVar35 = vandps_avx512vl(auVar35,auVar239._0_16_);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  local_288._8_8_ = auVar45._0_8_;
  local_288._0_8_ = auVar45._0_8_;
  local_298 = vmovddup_avx512vl(auVar46);
  local_2a8 = vmovddup_avx512vl(auVar44);
  local_2b8._0_8_ = auVar50._0_8_;
  local_2b8._8_8_ = local_2b8._0_8_;
  register0x00001348 = auVar41._0_8_;
  local_2c8 = auVar41._0_8_;
  register0x00001388 = auVar49._0_8_;
  local_2d8 = auVar49._0_8_;
  register0x00001408 = auVar39._0_8_;
  local_2e8 = auVar39._0_8_;
  register0x00001448 = auVar40._0_8_;
  local_2f8 = auVar40._0_8_;
  local_108 = ZEXT416((uint)(auVar35._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_108);
  auVar35 = vxorps_avx512vl(local_b8._0_16_,auVar87);
  local_78 = auVar35._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_c8 = vsubps_avx512vl(local_268,local_308);
  local_d8 = vsubps_avx512vl(local_278,local_268);
  local_e8 = vsubps_avx512vl(_local_f8,local_278);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar29 = false;
  auVar35 = ZEXT816(0x3f80000000000000);
  uVar25 = 0;
  auVar99 = auVar35;
LAB_0180f99c:
  auVar241 = ZEXT3264(local_b8);
  auVar36 = vshufps_avx(auVar99,auVar99,0x50);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = 0x3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar230._16_4_ = 0x3f800000;
  auVar230._0_16_ = auVar227;
  auVar230._20_4_ = 0x3f800000;
  auVar230._24_4_ = 0x3f800000;
  auVar230._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar227,auVar36);
  fVar209 = auVar36._0_4_;
  auVar129._0_4_ = local_2c8._0_4_ * fVar209;
  fVar190 = auVar36._4_4_;
  auVar129._4_4_ = local_2c8._4_4_ * fVar190;
  fVar202 = auVar36._8_4_;
  auVar129._8_4_ = local_2c8._8_4_ * fVar202;
  fVar204 = auVar36._12_4_;
  auVar129._12_4_ = local_2c8._12_4_ * fVar204;
  auVar140._0_4_ = local_2d8._0_4_ * fVar209;
  auVar140._4_4_ = local_2d8._4_4_ * fVar190;
  auVar140._8_4_ = local_2d8._8_4_ * fVar202;
  auVar140._12_4_ = local_2d8._12_4_ * fVar204;
  auVar149._0_4_ = local_2e8._0_4_ * fVar209;
  auVar149._4_4_ = local_2e8._4_4_ * fVar190;
  auVar149._8_4_ = local_2e8._8_4_ * fVar202;
  auVar149._12_4_ = local_2e8._12_4_ * fVar204;
  auVar108._0_4_ = local_2f8._0_4_ * fVar209;
  auVar108._4_4_ = local_2f8._4_4_ * fVar190;
  auVar108._8_4_ = local_2f8._8_4_ * fVar202;
  auVar108._12_4_ = local_2f8._12_4_ * fVar204;
  auVar38 = vfmadd231ps_fma(auVar129,auVar37,local_288);
  auVar45 = vfmadd231ps_avx512vl(auVar140,auVar37,local_298);
  auVar46 = vfmadd231ps_avx512vl(auVar149,auVar37,local_2a8);
  auVar37 = vfmadd231ps_fma(auVar108,local_2b8,auVar37);
  auVar36 = vmovshdup_avx(auVar35);
  fVar190 = auVar35._0_4_;
  fVar209 = (auVar36._0_4_ - fVar190) * 0.04761905;
  auVar67._4_4_ = fVar190;
  auVar67._0_4_ = fVar190;
  auVar67._8_4_ = fVar190;
  auVar67._12_4_ = fVar190;
  auVar67._16_4_ = fVar190;
  auVar67._20_4_ = fVar190;
  auVar67._24_4_ = fVar190;
  auVar67._28_4_ = fVar190;
  auVar62._0_8_ = auVar36._0_8_;
  auVar62._8_8_ = auVar62._0_8_;
  auVar62._16_8_ = auVar62._0_8_;
  auVar62._24_8_ = auVar62._0_8_;
  auVar70 = vsubps_avx(auVar62,auVar67);
  uVar86 = auVar38._0_4_;
  auVar72._4_4_ = uVar86;
  auVar72._0_4_ = uVar86;
  auVar72._8_4_ = uVar86;
  auVar72._12_4_ = uVar86;
  auVar72._16_4_ = uVar86;
  auVar72._20_4_ = uVar86;
  auVar72._24_4_ = uVar86;
  auVar72._28_4_ = uVar86;
  auVar132._8_4_ = 1;
  auVar132._0_8_ = 0x100000001;
  auVar132._12_4_ = 1;
  auVar132._16_4_ = 1;
  auVar132._20_4_ = 1;
  auVar132._24_4_ = 1;
  auVar132._28_4_ = 1;
  auVar69 = ZEXT1632(auVar38);
  auVar68 = vpermps_avx2(auVar132,auVar69);
  auVar53 = vbroadcastss_avx512vl(auVar45);
  auVar63 = ZEXT1632(auVar45);
  auVar54 = vpermps_avx512vl(auVar132,auVar63);
  auVar55 = vbroadcastss_avx512vl(auVar46);
  auVar64 = ZEXT1632(auVar46);
  auVar56 = vpermps_avx512vl(auVar132,auVar64);
  auVar57 = vbroadcastss_avx512vl(auVar37);
  auVar66 = ZEXT1632(auVar37);
  auVar58 = vpermps_avx512vl(auVar132,auVar66);
  auVar146._4_4_ = fVar209;
  auVar146._0_4_ = fVar209;
  auVar146._8_4_ = fVar209;
  auVar146._12_4_ = fVar209;
  auVar146._16_4_ = fVar209;
  auVar146._20_4_ = fVar209;
  auVar146._24_4_ = fVar209;
  auVar146._28_4_ = fVar209;
  auVar65._8_4_ = 2;
  auVar65._0_8_ = 0x200000002;
  auVar65._12_4_ = 2;
  auVar65._16_4_ = 2;
  auVar65._20_4_ = 2;
  auVar65._24_4_ = 2;
  auVar65._28_4_ = 2;
  auVar59 = vpermps_avx512vl(auVar65,auVar69);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar61 = vpermps_avx512vl(auVar60,auVar69);
  auVar62 = vpermps_avx512vl(auVar65,auVar63);
  auVar63 = vpermps_avx512vl(auVar60,auVar63);
  auVar69 = vpermps_avx2(auVar65,auVar64);
  auVar64 = vpermps_avx512vl(auVar60,auVar64);
  auVar65 = vpermps_avx512vl(auVar65,auVar66);
  auVar66 = vpermps_avx512vl(auVar60,auVar66);
  auVar36 = vfmadd132ps_fma(auVar70,auVar67,_DAT_01f7b040);
  auVar70 = vsubps_avx(auVar230,ZEXT1632(auVar36));
  auVar60 = vmulps_avx512vl(auVar53,ZEXT1632(auVar36));
  auVar71 = ZEXT1632(auVar36);
  auVar67 = vmulps_avx512vl(auVar54,auVar71);
  auVar37 = vfmadd231ps_fma(auVar60,auVar70,auVar72);
  auVar38 = vfmadd231ps_fma(auVar67,auVar70,auVar68);
  auVar60 = vmulps_avx512vl(auVar55,auVar71);
  auVar67 = vmulps_avx512vl(auVar56,auVar71);
  auVar53 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar53);
  auVar54 = vfmadd231ps_avx512vl(auVar67,auVar70,auVar54);
  auVar60 = vmulps_avx512vl(auVar57,auVar71);
  auVar72 = ZEXT1632(auVar36);
  auVar58 = vmulps_avx512vl(auVar58,auVar72);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar55);
  auVar67 = vfmadd231ps_avx512vl(auVar58,auVar70,auVar56);
  fVar202 = auVar36._0_4_;
  fVar204 = auVar36._4_4_;
  auVar55._4_4_ = fVar204 * auVar53._4_4_;
  auVar55._0_4_ = fVar202 * auVar53._0_4_;
  fVar206 = auVar36._8_4_;
  auVar55._8_4_ = fVar206 * auVar53._8_4_;
  fVar207 = auVar36._12_4_;
  auVar55._12_4_ = fVar207 * auVar53._12_4_;
  auVar55._16_4_ = auVar53._16_4_ * 0.0;
  auVar55._20_4_ = auVar53._20_4_ * 0.0;
  auVar55._24_4_ = auVar53._24_4_ * 0.0;
  auVar55._28_4_ = fVar190;
  auVar56._4_4_ = fVar204 * auVar54._4_4_;
  auVar56._0_4_ = fVar202 * auVar54._0_4_;
  auVar56._8_4_ = fVar206 * auVar54._8_4_;
  auVar56._12_4_ = fVar207 * auVar54._12_4_;
  auVar56._16_4_ = auVar54._16_4_ * 0.0;
  auVar56._20_4_ = auVar54._20_4_ * 0.0;
  auVar56._24_4_ = auVar54._24_4_ * 0.0;
  auVar56._28_4_ = auVar68._28_4_;
  auVar37 = vfmadd231ps_fma(auVar55,auVar70,ZEXT1632(auVar37));
  auVar38 = vfmadd231ps_fma(auVar56,auVar70,ZEXT1632(auVar38));
  auVar71._0_4_ = fVar202 * auVar60._0_4_;
  auVar71._4_4_ = fVar204 * auVar60._4_4_;
  auVar71._8_4_ = fVar206 * auVar60._8_4_;
  auVar71._12_4_ = fVar207 * auVar60._12_4_;
  auVar71._16_4_ = auVar60._16_4_ * 0.0;
  auVar71._20_4_ = auVar60._20_4_ * 0.0;
  auVar71._24_4_ = auVar60._24_4_ * 0.0;
  auVar71._28_4_ = 0;
  auVar58._4_4_ = fVar204 * auVar67._4_4_;
  auVar58._0_4_ = fVar202 * auVar67._0_4_;
  auVar58._8_4_ = fVar206 * auVar67._8_4_;
  auVar58._12_4_ = fVar207 * auVar67._12_4_;
  auVar58._16_4_ = auVar67._16_4_ * 0.0;
  auVar58._20_4_ = auVar67._20_4_ * 0.0;
  auVar58._24_4_ = auVar67._24_4_ * 0.0;
  auVar58._28_4_ = auVar60._28_4_;
  auVar45 = vfmadd231ps_fma(auVar71,auVar70,auVar53);
  auVar46 = vfmadd231ps_fma(auVar58,auVar70,auVar54);
  auVar60._28_4_ = auVar54._28_4_;
  auVar60._0_28_ =
       ZEXT1628(CONCAT412(fVar207 * auVar46._12_4_,
                          CONCAT48(fVar206 * auVar46._8_4_,
                                   CONCAT44(fVar204 * auVar46._4_4_,fVar202 * auVar46._0_4_))));
  auVar44 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar207 * auVar45._12_4_,
                                               CONCAT48(fVar206 * auVar45._8_4_,
                                                        CONCAT44(fVar204 * auVar45._4_4_,
                                                                 fVar202 * auVar45._0_4_)))),auVar70
                            ,ZEXT1632(auVar37));
  auVar50 = vfmadd231ps_fma(auVar60,auVar70,ZEXT1632(auVar38));
  auVar68 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar37));
  auVar53 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar38));
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar68 = vmulps_avx512vl(auVar68,auVar54);
  auVar53 = vmulps_avx512vl(auVar53,auVar54);
  auVar73._0_4_ = fVar209 * auVar68._0_4_;
  auVar73._4_4_ = fVar209 * auVar68._4_4_;
  auVar73._8_4_ = fVar209 * auVar68._8_4_;
  auVar73._12_4_ = fVar209 * auVar68._12_4_;
  auVar73._16_4_ = fVar209 * auVar68._16_4_;
  auVar73._20_4_ = fVar209 * auVar68._20_4_;
  auVar73._24_4_ = fVar209 * auVar68._24_4_;
  auVar73._28_4_ = 0;
  auVar68 = vmulps_avx512vl(auVar146,auVar53);
  auVar38 = vxorps_avx512vl(auVar57._0_16_,auVar57._0_16_);
  auVar55 = vpermt2ps_avx512vl(ZEXT1632(auVar44),_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar56 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar112._0_4_ = auVar73._0_4_ + auVar44._0_4_;
  auVar112._4_4_ = auVar73._4_4_ + auVar44._4_4_;
  auVar112._8_4_ = auVar73._8_4_ + auVar44._8_4_;
  auVar112._12_4_ = auVar73._12_4_ + auVar44._12_4_;
  auVar112._16_4_ = auVar73._16_4_ + 0.0;
  auVar112._20_4_ = auVar73._20_4_ + 0.0;
  auVar112._24_4_ = auVar73._24_4_ + 0.0;
  auVar112._28_4_ = 0;
  auVar67 = ZEXT1632(auVar38);
  auVar53 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar67);
  auVar58 = vaddps_avx512vl(ZEXT1632(auVar50),auVar68);
  auVar60 = vpermt2ps_avx512vl(auVar68,_DAT_01fb9fc0,auVar67);
  auVar68 = vsubps_avx(auVar55,auVar53);
  auVar60 = vsubps_avx512vl(auVar56,auVar60);
  auVar53 = vmulps_avx512vl(auVar62,auVar72);
  auVar57 = vmulps_avx512vl(auVar63,auVar72);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar70,auVar59);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar70,auVar61);
  auVar59 = vmulps_avx512vl(auVar69,auVar72);
  auVar61 = vmulps_avx512vl(auVar64,auVar72);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar70,auVar62);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar70,auVar63);
  auVar62 = vmulps_avx512vl(auVar65,auVar72);
  auVar63 = vmulps_avx512vl(auVar66,auVar72);
  auVar37 = vfmadd231ps_fma(auVar62,auVar70,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar64);
  auVar62 = vmulps_avx512vl(auVar72,auVar59);
  auVar65 = ZEXT1632(auVar36);
  auVar63 = vmulps_avx512vl(auVar65,auVar61);
  auVar53 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar53);
  auVar62 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar57);
  auVar69 = vmulps_avx512vl(auVar65,auVar69);
  auVar59 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar207 * auVar37._12_4_,
                                          CONCAT48(fVar206 * auVar37._8_4_,
                                                   CONCAT44(fVar204 * auVar37._4_4_,
                                                            fVar202 * auVar37._0_4_)))),auVar70,
                       auVar59);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar70,auVar61);
  auVar57._4_4_ = fVar204 * auVar59._4_4_;
  auVar57._0_4_ = fVar202 * auVar59._0_4_;
  auVar57._8_4_ = fVar206 * auVar59._8_4_;
  auVar57._12_4_ = fVar207 * auVar59._12_4_;
  auVar57._16_4_ = auVar59._16_4_ * 0.0;
  auVar57._20_4_ = auVar59._20_4_ * 0.0;
  auVar57._24_4_ = auVar59._24_4_ * 0.0;
  auVar57._28_4_ = auVar64._28_4_;
  auVar61 = vmulps_avx512vl(auVar65,auVar69);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar70,auVar53);
  auVar63 = vfmadd231ps_avx512vl(auVar61,auVar62,auVar70);
  auVar70 = vsubps_avx512vl(auVar59,auVar53);
  auVar53 = vsubps_avx512vl(auVar69,auVar62);
  auVar70 = vmulps_avx512vl(auVar70,auVar54);
  auVar53 = vmulps_avx512vl(auVar53,auVar54);
  fVar190 = fVar209 * auVar70._0_4_;
  fVar202 = fVar209 * auVar70._4_4_;
  auVar59._4_4_ = fVar202;
  auVar59._0_4_ = fVar190;
  fVar204 = fVar209 * auVar70._8_4_;
  auVar59._8_4_ = fVar204;
  fVar206 = fVar209 * auVar70._12_4_;
  auVar59._12_4_ = fVar206;
  fVar207 = fVar209 * auVar70._16_4_;
  auVar59._16_4_ = fVar207;
  fVar208 = fVar209 * auVar70._20_4_;
  auVar59._20_4_ = fVar208;
  fVar209 = fVar209 * auVar70._24_4_;
  auVar59._24_4_ = fVar209;
  auVar59._28_4_ = auVar70._28_4_;
  auVar53 = vmulps_avx512vl(auVar146,auVar53);
  auVar69 = vpermt2ps_avx512vl(auVar57,_DAT_01fb9fc0,auVar67);
  auVar54 = vpermt2ps_avx512vl(auVar63,_DAT_01fb9fc0,auVar67);
  auVar188._0_4_ = auVar57._0_4_ + fVar190;
  auVar188._4_4_ = auVar57._4_4_ + fVar202;
  auVar188._8_4_ = auVar57._8_4_ + fVar204;
  auVar188._12_4_ = auVar57._12_4_ + fVar206;
  auVar188._16_4_ = auVar57._16_4_ + fVar207;
  auVar188._20_4_ = auVar57._20_4_ + fVar208;
  auVar188._24_4_ = auVar57._24_4_ + fVar209;
  auVar188._28_4_ = auVar57._28_4_ + auVar70._28_4_;
  auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar59 = vaddps_avx512vl(auVar63,auVar53);
  auVar61 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar53 = vsubps_avx(auVar69,auVar70);
  auVar62 = vsubps_avx512vl(auVar54,auVar61);
  in_ZMM17 = ZEXT3264(auVar62);
  auVar132 = ZEXT1632(auVar44);
  auVar70 = vsubps_avx512vl(auVar57,auVar132);
  auVar146 = ZEXT1632(auVar50);
  auVar61 = vsubps_avx512vl(auVar63,auVar146);
  auVar64 = vsubps_avx512vl(auVar69,auVar55);
  auVar70 = vaddps_avx512vl(auVar70,auVar64);
  auVar64 = vsubps_avx512vl(auVar54,auVar56);
  auVar61 = vaddps_avx512vl(auVar61,auVar64);
  auVar64 = vmulps_avx512vl(auVar146,auVar70);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar132,auVar61);
  auVar65 = vmulps_avx512vl(auVar58,auVar70);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar112,auVar61);
  auVar66 = vmulps_avx512vl(auVar60,auVar70);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar68,auVar61);
  auVar67 = vmulps_avx512vl(auVar56,auVar70);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar55,auVar61);
  auVar71 = vmulps_avx512vl(auVar63,auVar70);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar57,auVar61);
  auVar72 = vmulps_avx512vl(auVar59,auVar70);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar188,auVar61);
  auVar73 = vmulps_avx512vl(auVar62,auVar70);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar53,auVar61);
  auVar70 = vmulps_avx512vl(auVar54,auVar70);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar61);
  auVar61 = vminps_avx512vl(auVar64,auVar65);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar66,auVar67);
  auVar61 = vminps_avx512vl(auVar61,auVar65);
  auVar65 = vmaxps_avx512vl(auVar66,auVar67);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar71,auVar72);
  auVar66 = vmaxps_avx512vl(auVar71,auVar72);
  auVar67 = vminps_avx512vl(auVar73,auVar70);
  auVar65 = vminps_avx512vl(auVar65,auVar67);
  auVar61 = vminps_avx512vl(auVar61,auVar65);
  auVar70 = vmaxps_avx512vl(auVar73,auVar70);
  auVar70 = vmaxps_avx512vl(auVar66,auVar70);
  auVar70 = vmaxps_avx512vl(auVar64,auVar70);
  uVar9 = vcmpps_avx512vl(auVar61,local_b8,2);
  auVar61._4_4_ = uStack_74;
  auVar61._0_4_ = local_78;
  auVar61._8_4_ = uStack_70;
  auVar61._12_4_ = uStack_6c;
  auVar61._16_4_ = uStack_68;
  auVar61._20_4_ = uStack_64;
  auVar61._24_4_ = uStack_60;
  auVar61._28_4_ = uStack_5c;
  uVar10 = vcmpps_avx512vl(auVar70,auVar61,5);
  bVar19 = (byte)uVar9 & (byte)uVar10 & 0x7f;
  auVar70 = _DAT_01fb9fe0;
  if (bVar19 == 0) {
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT3264(auVar68);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar237 = ZEXT1664(auVar35);
    auVar238 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar64 = vsubps_avx512vl(auVar55,auVar132);
    auVar65 = vsubps_avx512vl(auVar56,auVar146);
    auVar66 = vsubps_avx512vl(auVar69,auVar57);
    auVar64 = vaddps_avx512vl(auVar64,auVar66);
    auVar66 = vsubps_avx512vl(auVar54,auVar63);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar146,auVar64);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar132);
    auVar58 = vmulps_avx512vl(auVar58,auVar64);
    auVar58 = vfnmadd213ps_avx512vl(auVar112,auVar65,auVar58);
    auVar60 = vmulps_avx512vl(auVar60,auVar64);
    auVar60 = vfnmadd213ps_avx512vl(auVar68,auVar65,auVar60);
    auVar68 = vmulps_avx512vl(auVar56,auVar64);
    auVar55 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar55);
    auVar68 = vmulps_avx512vl(auVar63,auVar64);
    auVar56 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar57);
    auVar68 = vmulps_avx512vl(auVar59,auVar64);
    auVar57 = vfnmadd213ps_avx512vl(auVar188,auVar65,auVar68);
    auVar68 = vmulps_avx512vl(auVar62,auVar64);
    auVar59 = vfnmadd213ps_avx512vl(auVar53,auVar65,auVar68);
    auVar68 = vmulps_avx512vl(auVar54,auVar64);
    auVar62 = vfnmadd231ps_avx512vl(auVar68,auVar69,auVar65);
    auVar53 = vminps_avx(auVar66,auVar58);
    auVar68 = vmaxps_avx(auVar66,auVar58);
    auVar69 = vminps_avx(auVar60,auVar55);
    auVar69 = vminps_avx(auVar53,auVar69);
    auVar53 = vmaxps_avx(auVar60,auVar55);
    auVar68 = vmaxps_avx(auVar68,auVar53);
    auVar54 = vminps_avx(auVar56,auVar57);
    auVar53 = vmaxps_avx(auVar56,auVar57);
    auVar55 = vminps_avx(auVar59,auVar62);
    auVar54 = vminps_avx(auVar54,auVar55);
    auVar54 = vminps_avx(auVar69,auVar54);
    auVar69 = vmaxps_avx(auVar59,auVar62);
    auVar53 = vmaxps_avx(auVar53,auVar69);
    auVar68 = vmaxps_avx(auVar68,auVar53);
    uVar9 = vcmpps_avx512vl(auVar68,auVar61,5);
    uVar10 = vcmpps_avx512vl(auVar54,local_b8,2);
    bVar19 = bVar19 & (byte)uVar9 & (byte)uVar10;
    if (bVar19 != 0) {
      auStack_198[uVar25] = (uint)bVar19;
      uVar9 = vmovlps_avx(auVar35);
      (&uStack_98)[uVar25] = uVar9;
      uVar28 = vmovlps_avx(auVar99);
      auStack_58[uVar25] = uVar28;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT3264(auVar68);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar237 = ZEXT1664(auVar35);
    auVar238 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_0180fef9:
  do {
    do {
      do {
        auVar37 = auVar240._0_16_;
        auVar36 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar25 == 0) {
          if (bVar29) goto LAB_01810d68;
          fVar209 = ray->tfar;
          auVar17._4_4_ = fVar209;
          auVar17._0_4_ = fVar209;
          auVar17._8_4_ = fVar209;
          auVar17._12_4_ = fVar209;
          uVar9 = vcmpps_avx512vl(local_118,auVar17,2);
          uVar27 = (ulong)((uint)uVar26 & (uint)uVar9);
          goto LAB_0180f2d5;
        }
        uVar20 = (int)uVar25 - 1;
        uVar21 = (ulong)uVar20;
        uVar4 = auStack_198[uVar21];
        auVar99._8_8_ = 0;
        auVar99._0_8_ = auStack_58[uVar21];
        uVar28 = 0;
        for (uVar24 = (ulong)uVar4; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        uVar23 = uVar4 - 1 & uVar4;
        bVar32 = uVar23 == 0;
        auStack_198[uVar21] = uVar23;
        if (bVar32) {
          uVar25 = (ulong)uVar20;
        }
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar28;
        auVar35 = vpunpcklqdq_avx(auVar92,ZEXT416((int)uVar28 + 1));
        auVar35 = vcvtqq2ps_avx512vl(auVar35);
        auVar35 = vmulps_avx512vl(auVar35,auVar237._0_16_);
        uVar86 = *(undefined4 *)((long)&uStack_98 + uVar21 * 8 + 4);
        auVar11._4_4_ = uVar86;
        auVar11._0_4_ = uVar86;
        auVar11._8_4_ = uVar86;
        auVar11._12_4_ = uVar86;
        auVar38 = vmulps_avx512vl(auVar35,auVar11);
        auVar35 = vsubps_avx512vl(auVar37,auVar35);
        uVar86 = *(undefined4 *)(&uStack_98 + uVar21);
        auVar12._4_4_ = uVar86;
        auVar12._0_4_ = uVar86;
        auVar12._8_4_ = uVar86;
        auVar12._12_4_ = uVar86;
        auVar35 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar12);
        auVar38 = vmovshdup_avx(auVar35);
        fVar209 = auVar38._0_4_ - auVar35._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        if (uVar4 == 0 || bVar32) goto LAB_0180f99c;
        auVar38 = vshufps_avx(auVar99,auVar99,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        bVar30 = (uint)uVar25 < 4;
        uVar20 = (uint)uVar25 - 4;
        bVar33 = uVar20 == 0;
        bVar31 = (POPCOUNT(uVar20 & 0xff) & 1U) == 0;
        auVar44 = vsubps_avx512vl(auVar37,auVar38);
        fVar190 = auVar38._0_4_;
        auVar141._0_4_ = fVar190 * (float)local_2c8._0_4_;
        fVar202 = auVar38._4_4_;
        auVar141._4_4_ = fVar202 * (float)local_2c8._4_4_;
        fVar204 = auVar38._8_4_;
        auVar141._8_4_ = fVar204 * fStack_2c0;
        fVar206 = auVar38._12_4_;
        auVar141._12_4_ = fVar206 * fStack_2bc;
        auVar150._0_4_ = fVar190 * (float)local_2d8._0_4_;
        auVar150._4_4_ = fVar202 * (float)local_2d8._4_4_;
        auVar150._8_4_ = fVar204 * fStack_2d0;
        auVar150._12_4_ = fVar206 * fStack_2cc;
        auVar159._0_4_ = fVar190 * (float)local_2e8._0_4_;
        auVar159._4_4_ = fVar202 * (float)local_2e8._4_4_;
        auVar159._8_4_ = fVar204 * fStack_2e0;
        auVar159._12_4_ = fVar206 * fStack_2dc;
        auVar117._0_4_ = fVar190 * (float)local_2f8._0_4_;
        auVar117._4_4_ = fVar202 * (float)local_2f8._4_4_;
        auVar117._8_4_ = fVar204 * fStack_2f0;
        auVar117._12_4_ = fVar206 * fStack_2ec;
        auVar38 = vfmadd231ps_fma(auVar141,auVar44,local_288);
        auVar45 = vfmadd231ps_fma(auVar150,auVar44,local_298);
        auVar46 = vfmadd231ps_fma(auVar159,auVar44,local_2a8);
        auVar44 = vfmadd231ps_fma(auVar117,auVar44,local_2b8);
        auVar63._16_16_ = auVar38;
        auVar63._0_16_ = auVar38;
        auVar64._16_16_ = auVar45;
        auVar64._0_16_ = auVar45;
        auVar154._16_16_ = auVar46;
        auVar154._0_16_ = auVar46;
        auVar68 = vpermps_avx512vl(auVar238._0_32_,ZEXT1632(auVar35));
        auVar70 = vsubps_avx(auVar64,auVar63);
        auVar45 = vfmadd213ps_fma(auVar70,auVar68,auVar63);
        auVar70 = vsubps_avx(auVar154,auVar64);
        auVar50 = vfmadd213ps_fma(auVar70,auVar68,auVar64);
        auVar38 = vsubps_avx(auVar44,auVar46);
        auVar66._16_16_ = auVar38;
        auVar66._0_16_ = auVar38;
        auVar38 = vfmadd213ps_fma(auVar66,auVar68,auVar154);
        auVar70 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar45));
        auVar45 = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar45));
        auVar70 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar50));
        auVar38 = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar50));
        auVar70 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar45));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar70,auVar68);
        auVar70 = vmulps_avx512vl(auVar70,auVar236._0_32_);
        auVar38 = vmulss_avx512f(ZEXT416((uint)fVar209),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar190 = auVar38._0_4_;
        auVar160._0_8_ =
             CONCAT44(auVar87._4_4_ + fVar190 * auVar70._4_4_,
                      auVar87._0_4_ + fVar190 * auVar70._0_4_);
        auVar160._8_4_ = auVar87._8_4_ + fVar190 * auVar70._8_4_;
        auVar160._12_4_ = auVar87._12_4_ + fVar190 * auVar70._12_4_;
        auVar142._0_4_ = fVar190 * auVar70._16_4_;
        auVar142._4_4_ = fVar190 * auVar70._20_4_;
        auVar142._8_4_ = fVar190 * auVar70._24_4_;
        auVar142._12_4_ = fVar190 * auVar70._28_4_;
        auVar40 = vsubps_avx((undefined1  [16])0x0,auVar142);
        auVar50 = vshufpd_avx(auVar87,auVar87,3);
        auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar38 = vsubps_avx(auVar50,auVar87);
        auVar45 = vsubps_avx(auVar41,(undefined1  [16])0x0);
        auVar176._0_4_ = auVar38._0_4_ + auVar45._0_4_;
        auVar176._4_4_ = auVar38._4_4_ + auVar45._4_4_;
        auVar176._8_4_ = auVar38._8_4_ + auVar45._8_4_;
        auVar176._12_4_ = auVar38._12_4_ + auVar45._12_4_;
        auVar38 = vshufps_avx(auVar87,auVar87,0xb1);
        auVar45 = vshufps_avx(auVar160,auVar160,0xb1);
        auVar46 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar44 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._4_4_ = auVar176._0_4_;
        auVar228._0_4_ = auVar176._0_4_;
        auVar228._8_4_ = auVar176._0_4_;
        auVar228._12_4_ = auVar176._0_4_;
        auVar49 = vshufps_avx(auVar176,auVar176,0x55);
        fVar190 = auVar49._0_4_;
        auVar186._0_4_ = auVar38._0_4_ * fVar190;
        fVar202 = auVar49._4_4_;
        auVar186._4_4_ = auVar38._4_4_ * fVar202;
        fVar204 = auVar49._8_4_;
        auVar186._8_4_ = auVar38._8_4_ * fVar204;
        fVar206 = auVar49._12_4_;
        auVar186._12_4_ = auVar38._12_4_ * fVar206;
        auVar193._0_4_ = auVar45._0_4_ * fVar190;
        auVar193._4_4_ = auVar45._4_4_ * fVar202;
        auVar193._8_4_ = auVar45._8_4_ * fVar204;
        auVar193._12_4_ = auVar45._12_4_ * fVar206;
        auVar212._0_4_ = auVar46._0_4_ * fVar190;
        auVar212._4_4_ = auVar46._4_4_ * fVar202;
        auVar212._8_4_ = auVar46._8_4_ * fVar204;
        auVar212._12_4_ = auVar46._12_4_ * fVar206;
        auVar177._0_4_ = auVar44._0_4_ * fVar190;
        auVar177._4_4_ = auVar44._4_4_ * fVar202;
        auVar177._8_4_ = auVar44._8_4_ * fVar204;
        auVar177._12_4_ = auVar44._12_4_ * fVar206;
        auVar38 = vfmadd231ps_fma(auVar186,auVar228,auVar87);
        auVar45 = vfmadd231ps_fma(auVar193,auVar228,auVar160);
        auVar42 = vfmadd231ps_fma(auVar212,auVar228,auVar40);
        auVar43 = vfmadd231ps_fma(auVar177,(undefined1  [16])0x0,auVar228);
        auVar49 = vshufpd_avx(auVar38,auVar38,1);
        auVar39 = vshufpd_avx(auVar45,auVar45,1);
        auVar47 = vshufpd_avx512vl(auVar42,auVar42,1);
        auVar48 = vshufpd_avx512vl(auVar43,auVar43,1);
        in_ZMM17 = ZEXT1664(auVar48);
        auVar46 = vminss_avx(auVar38,auVar45);
        auVar38 = vmaxss_avx(auVar45,auVar38);
        auVar44 = vminss_avx(auVar42,auVar43);
        auVar45 = vmaxss_avx(auVar43,auVar42);
        auVar46 = vminss_avx(auVar46,auVar44);
        auVar38 = vmaxss_avx(auVar45,auVar38);
        auVar44 = vminss_avx(auVar49,auVar39);
        auVar45 = vmaxss_avx(auVar39,auVar49);
        auVar49 = vminss_avx512f(auVar47,auVar48);
        auVar39 = vmaxss_avx512f(auVar48,auVar47);
        vmaxss_avx(auVar39,auVar45);
        auVar70._0_16_ = vminss_avx512f(auVar44,auVar49);
        vucomiss_avx512f(auVar46);
        if ((!bVar30 && !bVar33) &&
           (auVar45 = vucomiss_avx512f(auVar36), bVar34 = bVar33, !bVar30 && !bVar33)) break;
        auVar45 = vucomiss_avx512f(auVar36);
        auVar44 = vucomiss_avx512f(auVar70._0_16_);
        auVar38 = vucomiss_avx512f(auVar36);
        bVar34 = bVar30 || bVar33;
        bVar31 = bVar30 || bVar33;
        if (!bVar30 && !bVar33) break;
        uVar9 = vcmpps_avx512vl(auVar46,auVar44,5);
        uVar10 = vcmpps_avx512vl(auVar70._0_16_,auVar44,5);
        uVar20 = (uint)uVar9 & (uint)uVar10;
        bVar18 = (uVar20 & 1) == 0;
        bVar34 = (!bVar30 && !bVar33) && bVar18;
        bVar31 = (!bVar30 && !bVar33) && (uVar20 & 1) == 0;
      } while ((bVar30 || bVar33) || !bVar18);
      auVar49 = vxorps_avx512vl(auVar243._0_16_,auVar243._0_16_);
      vcmpss_avx512f(auVar46,auVar49,1);
      uVar9 = vcmpss_avx512f(auVar38,auVar49,1);
      bVar33 = (bool)((byte)uVar9 & 1);
      auVar75._16_16_ = auVar70._16_16_;
      auVar75._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
      auVar74._4_28_ = auVar75._4_28_;
      auVar74._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      vucomiss_avx512f(auVar74._0_16_);
      bVar31 = (bool)(!bVar34 | bVar31);
      bVar34 = bVar31 == false;
      auVar77._16_16_ = auVar70._16_16_;
      auVar77._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = (uint)bVar31 * auVar49._0_4_ + (uint)!bVar31 * 0x7f800000;
      auVar44 = auVar76._0_16_;
      auVar79._16_16_ = auVar70._16_16_;
      auVar79._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = (uint)bVar31 * auVar49._0_4_ + (uint)!bVar31 * -0x800000;
      auVar36 = auVar78._0_16_;
      auVar39 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
      auVar241 = ZEXT1664(auVar39);
      uVar9 = vcmpss_avx512f(auVar70._0_16_,auVar49,1);
      bVar33 = (bool)((byte)uVar9 & 1);
      auVar81._16_16_ = auVar70._16_16_;
      auVar81._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
      auVar80._4_28_ = auVar81._4_28_;
      auVar80._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      vucomiss_avx512f(auVar80._0_16_);
      if ((bVar31) || (bVar34)) {
        auVar49 = vucomiss_avx512f(auVar46);
        if ((bVar31) || (bVar34)) {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar42 = vxorps_avx512vl(auVar46,auVar16);
          auVar46 = vsubss_avx512f(auVar49,auVar46);
          auVar46 = vdivss_avx512f(auVar42,auVar46);
          auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
          auVar49 = vfmadd213ss_avx512f(auVar49,auVar39,auVar46);
          auVar46 = auVar49;
        }
        else {
          auVar46 = vxorps_avx512vl(auVar49,auVar49);
          vucomiss_avx512f(auVar46);
          auVar49 = ZEXT416(0x3f800000);
          if ((bVar31) || (bVar34)) {
            auVar49 = SUB6416(ZEXT464(0xff800000),0);
            auVar46 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar44 = vminss_avx512f(auVar44,auVar46);
        auVar36 = vmaxss_avx(auVar49,auVar36);
      }
      in_ZMM17 = ZEXT464(0x3f800000);
      auVar243 = ZEXT1664(local_308);
      uVar9 = vcmpss_avx512f(auVar45,auVar39,1);
      bVar31 = (bool)((byte)uVar9 & 1);
      auVar46 = in_ZMM17._0_16_;
      fVar190 = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * 0x3f800000);
      if ((auVar74._0_4_ != fVar190) || (NAN(auVar74._0_4_) || NAN(fVar190))) {
        fVar204 = auVar45._0_4_;
        fVar202 = auVar38._0_4_;
        if ((fVar204 != fVar202) || (NAN(fVar204) || NAN(fVar202))) {
          auVar15._8_4_ = 0x80000000;
          auVar15._0_8_ = 0x8000000080000000;
          auVar15._12_4_ = 0x80000000;
          auVar38 = vxorps_avx512vl(auVar38,auVar15);
          auVar178._0_4_ = auVar38._0_4_ / (fVar204 - fVar202);
          auVar178._4_12_ = auVar38._4_12_;
          auVar38 = vsubss_avx512f(auVar46,auVar178);
          auVar38 = vfmadd213ss_avx512f(auVar38,auVar39,auVar178);
          auVar45 = auVar38;
        }
        else if ((fVar202 != 0.0) || (auVar38 = auVar46, auVar45 = ZEXT816(0) << 0x40, NAN(fVar202))
                ) {
          auVar38 = SUB6416(ZEXT464(0xff800000),0);
          auVar45 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar44 = vminss_avx(auVar44,auVar45);
        auVar36 = vmaxss_avx(auVar38,auVar36);
      }
      bVar31 = auVar80._0_4_ != fVar190;
      auVar38 = vminss_avx512f(auVar44,auVar46);
      auVar83._16_16_ = auVar70._16_16_;
      auVar83._0_16_ = auVar44;
      auVar82._4_28_ = auVar83._4_28_;
      auVar82._0_4_ = (uint)bVar31 * auVar38._0_4_ + (uint)!bVar31 * auVar44._0_4_;
      auVar38 = vmaxss_avx512f(auVar46,auVar36);
      auVar85._16_16_ = auVar70._16_16_;
      auVar85._0_16_ = auVar36;
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar31 * auVar38._0_4_ + (uint)!bVar31 * auVar36._0_4_;
      auVar36 = vmaxss_avx512f(auVar39,auVar82._0_16_);
      auVar70._0_16_ = vminss_avx512f(auVar84._0_16_,auVar46);
    } while (auVar70._0_4_ < auVar36._0_4_);
    auVar44 = vmaxss_avx512f(auVar39,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
    auVar42 = vminss_avx512f(ZEXT416((uint)(auVar70._0_4_ + 0.1)),auVar46);
    auVar118._0_8_ = auVar87._0_8_;
    auVar118._8_8_ = auVar118._0_8_;
    auVar194._8_8_ = auVar160._0_8_;
    auVar194._0_8_ = auVar160._0_8_;
    auVar213._8_8_ = auVar40._0_8_;
    auVar213._0_8_ = auVar40._0_8_;
    auVar36 = vshufpd_avx(auVar160,auVar160,3);
    auVar38 = vshufpd_avx(auVar40,auVar40,3);
    auVar45 = vshufps_avx(auVar44,auVar42,0);
    auVar40 = vsubps_avx512vl(auVar37,auVar45);
    fVar190 = auVar45._0_4_;
    auVar151._0_4_ = fVar190 * auVar50._0_4_;
    fVar202 = auVar45._4_4_;
    auVar151._4_4_ = fVar202 * auVar50._4_4_;
    fVar204 = auVar45._8_4_;
    auVar151._8_4_ = fVar204 * auVar50._8_4_;
    fVar206 = auVar45._12_4_;
    auVar151._12_4_ = fVar206 * auVar50._12_4_;
    auVar161._0_4_ = fVar190 * auVar36._0_4_;
    auVar161._4_4_ = fVar202 * auVar36._4_4_;
    auVar161._8_4_ = fVar204 * auVar36._8_4_;
    auVar161._12_4_ = fVar206 * auVar36._12_4_;
    auVar232._0_4_ = auVar38._0_4_ * fVar190;
    auVar232._4_4_ = auVar38._4_4_ * fVar202;
    auVar232._8_4_ = auVar38._8_4_ * fVar204;
    auVar232._12_4_ = auVar38._12_4_ * fVar206;
    auVar143._0_4_ = fVar190 * auVar41._0_4_;
    auVar143._4_4_ = fVar202 * auVar41._4_4_;
    auVar143._8_4_ = fVar204 * auVar41._8_4_;
    auVar143._12_4_ = fVar206 * auVar41._12_4_;
    auVar50 = vfmadd231ps_fma(auVar151,auVar40,auVar118);
    auVar41 = vfmadd231ps_fma(auVar161,auVar40,auVar194);
    auVar49 = vfmadd231ps_fma(auVar232,auVar40,auVar213);
    auVar40 = vfmadd231ps_fma(auVar143,auVar40,ZEXT816(0));
    auVar38 = vsubss_avx512f(auVar46,auVar44);
    auVar36 = vmovshdup_avx(auVar99);
    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar44._0_4_)),auVar99,auVar38);
    auVar38 = vsubss_avx512f(auVar46,auVar42);
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar42._0_4_)),auVar99,auVar38);
    auVar42 = vdivss_avx512f(auVar46,ZEXT416((uint)fVar209));
    auVar36 = vsubps_avx(auVar41,auVar50);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar45 = vmulps_avx512vl(auVar36,auVar43);
    auVar36 = vsubps_avx(auVar49,auVar41);
    auVar44 = vmulps_avx512vl(auVar36,auVar43);
    auVar36 = vsubps_avx(auVar40,auVar49);
    auVar36 = vmulps_avx512vl(auVar36,auVar43);
    auVar38 = vminps_avx(auVar44,auVar36);
    auVar36 = vmaxps_avx(auVar44,auVar36);
    auVar38 = vminps_avx(auVar45,auVar38);
    auVar36 = vmaxps_avx(auVar45,auVar36);
    auVar45 = vshufpd_avx(auVar38,auVar38,3);
    auVar44 = vshufpd_avx(auVar36,auVar36,3);
    auVar38 = vminps_avx(auVar38,auVar45);
    auVar36 = vmaxps_avx(auVar36,auVar44);
    fVar209 = auVar42._0_4_;
    auVar179._0_4_ = auVar38._0_4_ * fVar209;
    auVar179._4_4_ = auVar38._4_4_ * fVar209;
    auVar179._8_4_ = auVar38._8_4_ * fVar209;
    auVar179._12_4_ = auVar38._12_4_ * fVar209;
    auVar169._0_4_ = fVar209 * auVar36._0_4_;
    auVar169._4_4_ = fVar209 * auVar36._4_4_;
    auVar169._8_4_ = fVar209 * auVar36._8_4_;
    auVar169._12_4_ = fVar209 * auVar36._12_4_;
    auVar42 = vdivss_avx512f(auVar46,ZEXT416((uint)(auVar47._0_4_ - auVar87._0_4_)));
    auVar36 = vshufpd_avx(auVar50,auVar50,3);
    auVar38 = vshufpd_avx(auVar41,auVar41,3);
    auVar45 = vshufpd_avx(auVar49,auVar49,3);
    auVar46 = vshufpd_avx(auVar40,auVar40,3);
    auVar36 = vsubps_avx(auVar36,auVar50);
    auVar44 = vsubps_avx(auVar38,auVar41);
    auVar50 = vsubps_avx(auVar45,auVar49);
    auVar46 = vsubps_avx(auVar46,auVar40);
    auVar38 = vminps_avx(auVar36,auVar44);
    auVar36 = vmaxps_avx(auVar36,auVar44);
    auVar45 = vminps_avx(auVar50,auVar46);
    auVar45 = vminps_avx(auVar38,auVar45);
    auVar38 = vmaxps_avx(auVar50,auVar46);
    auVar36 = vmaxps_avx(auVar36,auVar38);
    fVar209 = auVar42._0_4_;
    auVar214._0_4_ = fVar209 * auVar45._0_4_;
    auVar214._4_4_ = fVar209 * auVar45._4_4_;
    auVar214._8_4_ = fVar209 * auVar45._8_4_;
    auVar214._12_4_ = fVar209 * auVar45._12_4_;
    auVar195._0_4_ = fVar209 * auVar36._0_4_;
    auVar195._4_4_ = fVar209 * auVar36._4_4_;
    auVar195._8_4_ = fVar209 * auVar36._8_4_;
    auVar195._12_4_ = fVar209 * auVar36._12_4_;
    auVar46 = vinsertps_avx(auVar35,auVar87,0x10);
    auVar48 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9f90,auVar47);
    auVar100._0_4_ = auVar46._0_4_ + auVar48._0_4_;
    auVar100._4_4_ = auVar46._4_4_ + auVar48._4_4_;
    auVar100._8_4_ = auVar46._8_4_ + auVar48._8_4_;
    auVar100._12_4_ = auVar46._12_4_ + auVar48._12_4_;
    auVar13._8_4_ = 0x3f000000;
    auVar13._0_8_ = 0x3f0000003f000000;
    auVar13._12_4_ = 0x3f000000;
    auVar40 = vmulps_avx512vl(auVar100,auVar13);
    auVar38 = vshufps_avx(auVar40,auVar40,0x54);
    uVar86 = auVar40._0_4_;
    auVar109._4_4_ = uVar86;
    auVar109._0_4_ = uVar86;
    auVar109._8_4_ = uVar86;
    auVar109._12_4_ = uVar86;
    auVar50 = vfmadd213ps_avx512vl(local_c8,auVar109,local_308);
    auVar45 = vfmadd213ps_fma(local_d8,auVar109,local_268);
    auVar44 = vfmadd213ps_fma(local_e8,auVar109,local_278);
    auVar36 = vsubps_avx(auVar45,auVar50);
    auVar50 = vfmadd213ps_fma(auVar36,auVar109,auVar50);
    auVar36 = vsubps_avx(auVar44,auVar45);
    auVar36 = vfmadd213ps_fma(auVar36,auVar109,auVar45);
    auVar36 = vsubps_avx(auVar36,auVar50);
    auVar45 = vfmadd231ps_fma(auVar50,auVar36,auVar109);
    auVar41 = vmulps_avx512vl(auVar36,auVar43);
    auVar223._8_8_ = auVar45._0_8_;
    auVar223._0_8_ = auVar45._0_8_;
    auVar36 = vshufpd_avx(auVar45,auVar45,3);
    auVar45 = vshufps_avx(auVar40,auVar40,0x55);
    auVar44 = vsubps_avx(auVar36,auVar223);
    auVar50 = vfmadd231ps_fma(auVar223,auVar45,auVar44);
    auVar233._8_8_ = auVar41._0_8_;
    auVar233._0_8_ = auVar41._0_8_;
    auVar36 = vshufpd_avx(auVar41,auVar41,3);
    auVar36 = vsubps_avx512vl(auVar36,auVar233);
    auVar36 = vfmadd213ps_avx512vl(auVar36,auVar45,auVar233);
    auVar45 = vxorps_avx512vl(auVar44,auVar242._0_16_);
    auVar41 = vmovshdup_avx512vl(auVar36);
    auVar49 = vxorps_avx512vl(auVar41,auVar242._0_16_);
    auVar42 = vmovshdup_avx512vl(auVar44);
    auVar49 = vpermt2ps_avx512vl(auVar49,ZEXT416(5),auVar44);
    auVar243 = ZEXT1664(local_308);
    auVar44 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar44._0_4_)),auVar36,auVar42);
    auVar45 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar45);
    auVar144._0_4_ = auVar44._0_4_;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    auVar36 = vdivps_avx(auVar49,auVar144);
    auVar51 = vdivps_avx512vl(auVar45,auVar144);
    fVar209 = auVar50._0_4_;
    auVar45 = vshufps_avx(auVar50,auVar50,0x55);
    auVar224._0_4_ = fVar209 * auVar36._0_4_ + auVar45._0_4_ * auVar51._0_4_;
    auVar224._4_4_ = fVar209 * auVar36._4_4_ + auVar45._4_4_ * auVar51._4_4_;
    auVar224._8_4_ = fVar209 * auVar36._8_4_ + auVar45._8_4_ * auVar51._8_4_;
    auVar224._12_4_ = fVar209 * auVar36._12_4_ + auVar45._12_4_ * auVar51._12_4_;
    auVar42 = vsubps_avx(auVar38,auVar224);
    auVar45 = vmovshdup_avx(auVar36);
    auVar38 = vinsertps_avx(auVar179,auVar214,0x1c);
    auVar234._0_4_ = auVar45._0_4_ * auVar38._0_4_;
    auVar234._4_4_ = auVar45._4_4_ * auVar38._4_4_;
    auVar234._8_4_ = auVar45._8_4_ * auVar38._8_4_;
    auVar234._12_4_ = auVar45._12_4_ * auVar38._12_4_;
    auVar43 = vinsertps_avx512f(auVar169,auVar195,0x1c);
    auVar45 = vmulps_avx512vl(auVar45,auVar43);
    auVar49 = vminps_avx512vl(auVar234,auVar45);
    auVar50 = vmaxps_avx(auVar45,auVar234);
    auVar41 = vmovshdup_avx(auVar51);
    auVar45 = vinsertps_avx(auVar214,auVar179,0x4c);
    auVar215._0_4_ = auVar41._0_4_ * auVar45._0_4_;
    auVar215._4_4_ = auVar41._4_4_ * auVar45._4_4_;
    auVar215._8_4_ = auVar41._8_4_ * auVar45._8_4_;
    auVar215._12_4_ = auVar41._12_4_ * auVar45._12_4_;
    auVar44 = vinsertps_avx(auVar195,auVar169,0x4c);
    auVar196._0_4_ = auVar41._0_4_ * auVar44._0_4_;
    auVar196._4_4_ = auVar41._4_4_ * auVar44._4_4_;
    auVar196._8_4_ = auVar41._8_4_ * auVar44._8_4_;
    auVar196._12_4_ = auVar41._12_4_ * auVar44._12_4_;
    auVar41 = vminps_avx(auVar215,auVar196);
    auVar49 = vaddps_avx512vl(auVar49,auVar41);
    auVar41 = vmaxps_avx(auVar196,auVar215);
    auVar197._0_4_ = auVar50._0_4_ + auVar41._0_4_;
    auVar197._4_4_ = auVar50._4_4_ + auVar41._4_4_;
    auVar197._8_4_ = auVar50._8_4_ + auVar41._8_4_;
    auVar197._12_4_ = auVar50._12_4_ + auVar41._12_4_;
    auVar216._8_8_ = 0x3f80000000000000;
    auVar216._0_8_ = 0x3f80000000000000;
    auVar50 = vsubps_avx(auVar216,auVar197);
    auVar41 = vsubps_avx(auVar216,auVar49);
    auVar49 = vsubps_avx(auVar46,auVar40);
    auVar40 = vsubps_avx(auVar48,auVar40);
    fVar206 = auVar49._0_4_;
    auVar235._0_4_ = fVar206 * auVar50._0_4_;
    fVar207 = auVar49._4_4_;
    auVar235._4_4_ = fVar207 * auVar50._4_4_;
    fVar208 = auVar49._8_4_;
    auVar235._8_4_ = fVar208 * auVar50._8_4_;
    fVar101 = auVar49._12_4_;
    auVar235._12_4_ = fVar101 * auVar50._12_4_;
    auVar52 = vbroadcastss_avx512vl(auVar36);
    auVar38 = vmulps_avx512vl(auVar52,auVar38);
    auVar43 = vmulps_avx512vl(auVar52,auVar43);
    auVar52 = vminps_avx512vl(auVar38,auVar43);
    auVar43 = vmaxps_avx512vl(auVar43,auVar38);
    auVar38 = vbroadcastss_avx512vl(auVar51);
    auVar45 = vmulps_avx512vl(auVar38,auVar45);
    auVar38 = vmulps_avx512vl(auVar38,auVar44);
    auVar44 = vminps_avx512vl(auVar45,auVar38);
    auVar44 = vaddps_avx512vl(auVar52,auVar44);
    auVar49 = vmulps_avx512vl(auVar49,auVar41);
    in_ZMM17 = ZEXT1664(auVar49);
    fVar209 = auVar40._0_4_;
    auVar198._0_4_ = fVar209 * auVar50._0_4_;
    fVar190 = auVar40._4_4_;
    auVar198._4_4_ = fVar190 * auVar50._4_4_;
    fVar202 = auVar40._8_4_;
    auVar198._8_4_ = fVar202 * auVar50._8_4_;
    fVar204 = auVar40._12_4_;
    auVar198._12_4_ = fVar204 * auVar50._12_4_;
    auVar217._0_4_ = fVar209 * auVar41._0_4_;
    auVar217._4_4_ = fVar190 * auVar41._4_4_;
    auVar217._8_4_ = fVar202 * auVar41._8_4_;
    auVar217._12_4_ = fVar204 * auVar41._12_4_;
    auVar38 = vmaxps_avx(auVar38,auVar45);
    auVar170._0_4_ = auVar43._0_4_ + auVar38._0_4_;
    auVar170._4_4_ = auVar43._4_4_ + auVar38._4_4_;
    auVar170._8_4_ = auVar43._8_4_ + auVar38._8_4_;
    auVar170._12_4_ = auVar43._12_4_ + auVar38._12_4_;
    auVar180._8_8_ = 0x3f800000;
    auVar180._0_8_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar180,auVar170);
    auVar45 = vsubps_avx512vl(auVar180,auVar44);
    auVar229._0_4_ = fVar206 * auVar38._0_4_;
    auVar229._4_4_ = fVar207 * auVar38._4_4_;
    auVar229._8_4_ = fVar208 * auVar38._8_4_;
    auVar229._12_4_ = fVar101 * auVar38._12_4_;
    auVar225._0_4_ = fVar206 * auVar45._0_4_;
    auVar225._4_4_ = fVar207 * auVar45._4_4_;
    auVar225._8_4_ = fVar208 * auVar45._8_4_;
    auVar225._12_4_ = fVar101 * auVar45._12_4_;
    auVar171._0_4_ = fVar209 * auVar38._0_4_;
    auVar171._4_4_ = fVar190 * auVar38._4_4_;
    auVar171._8_4_ = fVar202 * auVar38._8_4_;
    auVar171._12_4_ = fVar204 * auVar38._12_4_;
    auVar181._0_4_ = fVar209 * auVar45._0_4_;
    auVar181._4_4_ = fVar190 * auVar45._4_4_;
    auVar181._8_4_ = fVar202 * auVar45._8_4_;
    auVar181._12_4_ = fVar204 * auVar45._12_4_;
    auVar38 = vminps_avx(auVar229,auVar225);
    auVar45 = vminps_avx512vl(auVar171,auVar181);
    auVar44 = vminps_avx512vl(auVar38,auVar45);
    auVar38 = vmaxps_avx(auVar225,auVar229);
    auVar45 = vmaxps_avx(auVar181,auVar171);
    auVar45 = vmaxps_avx(auVar45,auVar38);
    auVar50 = vminps_avx512vl(auVar235,auVar49);
    auVar38 = vminps_avx(auVar198,auVar217);
    auVar38 = vminps_avx(auVar50,auVar38);
    auVar38 = vhaddps_avx(auVar44,auVar38);
    auVar70._0_16_ = vmaxps_avx512vl(auVar49,auVar235);
    auVar44 = vmaxps_avx(auVar217,auVar198);
    auVar44 = vmaxps_avx(auVar44,auVar70._0_16_);
    auVar45 = vhaddps_avx(auVar45,auVar44);
    auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar172._0_4_ = auVar38._0_4_ + auVar42._0_4_;
    auVar172._4_4_ = auVar38._4_4_ + auVar42._4_4_;
    auVar172._8_4_ = auVar38._8_4_ + auVar42._8_4_;
    auVar172._12_4_ = auVar38._12_4_ + auVar42._12_4_;
    auVar182._0_4_ = auVar45._0_4_ + auVar42._0_4_;
    auVar182._4_4_ = auVar45._4_4_ + auVar42._4_4_;
    auVar182._8_4_ = auVar45._8_4_ + auVar42._8_4_;
    auVar182._12_4_ = auVar45._12_4_ + auVar42._12_4_;
    auVar38 = vmaxps_avx(auVar46,auVar172);
    auVar45 = vminps_avx(auVar182,auVar48);
    uVar28 = vcmpps_avx512vl(auVar45,auVar38,1);
  } while ((uVar28 & 3) != 0);
  uVar28 = vcmpps_avx512vl(auVar182,auVar48,1);
  uVar9 = vcmpps_avx512vl(auVar35,auVar172,1);
  if (((ushort)uVar9 & (ushort)uVar28 & 1) == 0) {
    bVar19 = 0;
  }
  else {
    auVar38 = vmovshdup_avx(auVar172);
    bVar19 = auVar87._0_4_ < auVar38._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
  }
  if (((!bVar30 || uVar4 != 0 && !bVar32) | bVar19) != 1) goto LAB_01810cee;
  lVar22 = 0xc9;
  do {
    lVar22 = lVar22 + -1;
    if (lVar22 == 0) goto LAB_0180fef9;
    fVar204 = auVar42._0_4_;
    fVar202 = 1.0 - fVar204;
    fVar209 = fVar202 * fVar202 * fVar202;
    fVar190 = fVar204 * 3.0 * fVar202 * fVar202;
    fVar202 = fVar202 * fVar204 * fVar204 * 3.0;
    auVar130._4_4_ = fVar209;
    auVar130._0_4_ = fVar209;
    auVar130._8_4_ = fVar209;
    auVar130._12_4_ = fVar209;
    auVar119._4_4_ = fVar190;
    auVar119._0_4_ = fVar190;
    auVar119._8_4_ = fVar190;
    auVar119._12_4_ = fVar190;
    auVar93._4_4_ = fVar202;
    auVar93._0_4_ = fVar202;
    auVar93._8_4_ = fVar202;
    auVar93._12_4_ = fVar202;
    fVar204 = fVar204 * fVar204 * fVar204;
    auVar152._0_4_ = (float)local_f8._0_4_ * fVar204;
    auVar152._4_4_ = (float)local_f8._4_4_ * fVar204;
    auVar152._8_4_ = fStack_f0 * fVar204;
    auVar152._12_4_ = fStack_ec * fVar204;
    auVar35 = vfmadd231ps_fma(auVar152,local_278,auVar93);
    auVar35 = vfmadd231ps_fma(auVar35,local_268,auVar119);
    auVar35 = vfmadd231ps_avx512vl(auVar35,local_308,auVar130);
    auVar94._8_8_ = auVar35._0_8_;
    auVar94._0_8_ = auVar35._0_8_;
    auVar35 = vshufpd_avx(auVar35,auVar35,3);
    auVar38 = vshufps_avx(auVar42,auVar42,0x55);
    auVar35 = vsubps_avx(auVar35,auVar94);
    auVar38 = vfmadd213ps_fma(auVar35,auVar38,auVar94);
    fVar209 = auVar38._0_4_;
    auVar35 = vshufps_avx(auVar38,auVar38,0x55);
    auVar95._0_4_ = auVar36._0_4_ * fVar209 + auVar51._0_4_ * auVar35._0_4_;
    auVar95._4_4_ = auVar36._4_4_ * fVar209 + auVar51._4_4_ * auVar35._4_4_;
    auVar95._8_4_ = auVar36._8_4_ * fVar209 + auVar51._8_4_ * auVar35._8_4_;
    auVar95._12_4_ = auVar36._12_4_ * fVar209 + auVar51._12_4_ * auVar35._12_4_;
    auVar42 = vsubps_avx(auVar42,auVar95);
    auVar35 = vandps_avx512vl(auVar38,auVar239._0_16_);
    auVar70._0_16_ = vprolq_avx512vl(auVar35,0x20);
    auVar35 = vmaxss_avx(auVar70._0_16_,auVar35);
  } while ((float)local_108._0_4_ <= auVar35._0_4_);
  auVar36 = vucomiss_avx512f(auVar39);
  if ((float)local_108._0_4_ < auVar35._0_4_) goto LAB_0180fef9;
  fVar209 = auVar36._0_4_;
  if (1.0 < fVar209) goto LAB_0180fef9;
  vmovshdup_avx(auVar36);
  auVar35 = vucomiss_avx512f(auVar39);
  if ((1.0 < fVar209) || (fVar190 = auVar35._0_4_, 1.0 < fVar190)) goto LAB_0180fef9;
  auVar35 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar49 = vinsertps_avx(auVar35,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->org).field_0;
  auVar35 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar35 = vdpps_avx(auVar35,auVar49,0x7f);
  auVar38 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar38 = vdpps_avx(auVar38,auVar49,0x7f);
  auVar45 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar45 = vdpps_avx(auVar45,auVar49,0x7f);
  auVar46 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar46 = vdpps_avx(auVar46,auVar49,0x7f);
  auVar44 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar44 = vdpps_avx(auVar44,auVar49,0x7f);
  auVar50 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar50 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar41 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar41 = vdpps_avx(auVar41,auVar49,0x7f);
  auVar39 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar49 = vdpps_avx(auVar39,auVar49,0x7f);
  fVar202 = 1.0 - fVar190;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar190)),ZEXT416((uint)fVar202),auVar35)
  ;
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar190)),ZEXT416((uint)fVar202),auVar38)
  ;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar190)),ZEXT416((uint)fVar202),auVar45)
  ;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * auVar49._0_4_)),ZEXT416((uint)fVar202),auVar46)
  ;
  fVar206 = 1.0 - fVar209;
  fVar190 = fVar206 * fVar206 * fVar206;
  fVar202 = fVar209 * 3.0 * fVar206 * fVar206;
  fVar204 = fVar206 * fVar209 * fVar209 * 3.0;
  fVar208 = fVar209 * fVar209 * fVar209;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar46._0_4_)),ZEXT416((uint)fVar204),auVar45)
  ;
  auVar38 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar202),auVar38);
  auVar35 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar190),auVar35);
  fVar207 = auVar35._0_4_;
  if ((fVar207 < (ray->org).field_0.m128[3]) || (fVar101 = ray->tfar, fVar101 < fVar207))
  goto LAB_0180fef9;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar45 = vsubps_avx512vl(auVar37,auVar35);
  fVar113 = auVar35._0_4_;
  auVar183._0_4_ = fVar113 * (float)local_1b8._0_4_;
  fVar121 = auVar35._4_4_;
  auVar183._4_4_ = fVar121 * (float)local_1b8._4_4_;
  fVar122 = auVar35._8_4_;
  auVar183._8_4_ = fVar122 * fStack_1b0;
  fVar123 = auVar35._12_4_;
  auVar183._12_4_ = fVar123 * fStack_1ac;
  auVar187._0_4_ = fVar113 * (float)local_208._0_4_;
  auVar187._4_4_ = fVar121 * (float)local_208._4_4_;
  auVar187._8_4_ = fVar122 * fStack_200;
  auVar187._12_4_ = fVar123 * fStack_1fc;
  auVar199._0_4_ = fVar113 * (float)local_218._0_4_;
  auVar199._4_4_ = fVar121 * (float)local_218._4_4_;
  auVar199._8_4_ = fVar122 * fStack_210;
  auVar199._12_4_ = fVar123 * fStack_20c;
  auVar162._0_4_ = fVar113 * (float)local_1d8._0_4_;
  auVar162._4_4_ = fVar121 * (float)local_1d8._4_4_;
  auVar162._8_4_ = fVar122 * fStack_1d0;
  auVar162._12_4_ = fVar123 * fStack_1cc;
  auVar35 = vfmadd231ps_fma(auVar183,auVar45,local_1a8);
  auVar37 = vfmadd231ps_fma(auVar187,auVar45,local_1e8);
  auVar38 = vfmadd231ps_fma(auVar199,auVar45,local_1f8);
  auVar45 = vfmadd231ps_fma(auVar162,auVar45,local_1c8);
  auVar35 = vsubps_avx(auVar37,auVar35);
  auVar37 = vsubps_avx(auVar38,auVar37);
  auVar38 = vsubps_avx(auVar45,auVar38);
  auVar200._0_4_ = fVar209 * auVar37._0_4_;
  auVar200._4_4_ = fVar209 * auVar37._4_4_;
  auVar200._8_4_ = fVar209 * auVar37._8_4_;
  auVar200._12_4_ = fVar209 * auVar37._12_4_;
  auVar153._4_4_ = fVar206;
  auVar153._0_4_ = fVar206;
  auVar153._8_4_ = fVar206;
  auVar153._12_4_ = fVar206;
  auVar35 = vfmadd231ps_fma(auVar200,auVar153,auVar35);
  auVar163._0_4_ = fVar209 * auVar38._0_4_;
  auVar163._4_4_ = fVar209 * auVar38._4_4_;
  auVar163._8_4_ = fVar209 * auVar38._8_4_;
  auVar163._12_4_ = fVar209 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar163,auVar153,auVar37);
  auVar164._0_4_ = fVar209 * auVar37._0_4_;
  auVar164._4_4_ = fVar209 * auVar37._4_4_;
  auVar164._8_4_ = fVar209 * auVar37._8_4_;
  auVar164._12_4_ = fVar209 * auVar37._12_4_;
  auVar35 = vfmadd231ps_fma(auVar164,auVar153,auVar35);
  auVar14._8_4_ = 0x40400000;
  auVar14._0_8_ = 0x4040000040400000;
  auVar14._12_4_ = 0x40400000;
  auVar70._0_16_ = vmulps_avx512vl(auVar35,auVar14);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar19 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01810ce6;
    auVar145._0_4_ = fVar208 * (float)local_158._0_4_;
    auVar145._4_4_ = fVar208 * (float)local_158._4_4_;
    auVar145._8_4_ = fVar208 * fStack_150;
    auVar145._12_4_ = fVar208 * fStack_14c;
    auVar131._4_4_ = fVar204;
    auVar131._0_4_ = fVar204;
    auVar131._8_4_ = fVar204;
    auVar131._12_4_ = fVar204;
    auVar35 = vfmadd132ps_fma(auVar131,auVar145,local_148);
    auVar120._4_4_ = fVar202;
    auVar120._0_4_ = fVar202;
    auVar120._8_4_ = fVar202;
    auVar120._12_4_ = fVar202;
    auVar35 = vfmadd132ps_fma(auVar120,auVar35,local_138);
    auVar110._4_4_ = fVar190;
    auVar110._0_4_ = fVar190;
    auVar110._8_4_ = fVar190;
    auVar110._12_4_ = fVar190;
    auVar38 = vfmadd132ps_fma(auVar110,auVar35,local_128);
    auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
    auVar37 = vshufps_avx(auVar70._0_16_,auVar70._0_16_,0xc9);
    auVar111._0_4_ = auVar38._0_4_ * auVar37._0_4_;
    auVar111._4_4_ = auVar38._4_4_ * auVar37._4_4_;
    auVar111._8_4_ = auVar38._8_4_ * auVar37._8_4_;
    auVar111._12_4_ = auVar38._12_4_ * auVar37._12_4_;
    auVar37 = vfmsub231ps_fma(auVar111,auVar70._0_16_,auVar35);
    auVar35 = vshufps_avx(auVar37,auVar37,0xe9);
    local_188 = vmovlps_avx(auVar35);
    local_180 = auVar37._0_4_;
    local_17c = vmovlps_avx(auVar36);
    local_174 = (int)local_258;
    local_170 = (int)local_310;
    local_16c = context->user->instID[0];
    local_168 = context->user->instPrimID[0];
    ray->tfar = fVar207;
    local_314 = -1;
    local_248.valid = &local_314;
    local_248.geometryUserPtr = pGVar5->userPtr;
    local_248.context = context->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01810c18:
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var6)(&local_248);
        auVar238 = ZEXT3264(_DAT_01fb9fe0);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar237 = ZEXT1664(auVar35);
        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar236 = ZEXT3264(auVar70);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar242 = ZEXT1664(auVar35);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar240 = ZEXT1664(auVar35);
        auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar239 = ZEXT1664(auVar70._0_16_);
        if (*local_248.valid == 0) goto LAB_01810cd8;
      }
      bVar19 = 1;
      goto LAB_01810ce6;
    }
    (*pGVar5->occlusionFilterN)(&local_248);
    auVar238 = ZEXT3264(_DAT_01fb9fe0);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar237 = ZEXT1664(auVar35);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT3264(auVar70);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar242 = ZEXT1664(auVar35);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar240 = ZEXT1664(auVar35);
    auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar239 = ZEXT1664(auVar70._0_16_);
    if (*local_248.valid != 0) goto LAB_01810c18;
LAB_01810cd8:
    ray->tfar = fVar101;
  }
  bVar19 = 0;
LAB_01810ce6:
  bVar29 = (bool)(bVar29 | bVar19);
  goto LAB_0180fef9;
LAB_01810cee:
  auVar99 = vinsertps_avx(auVar87,auVar47,0x10);
  goto LAB_0180f99c;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }